

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

bool goodform::json::parse_array(istream *input,any *v)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  vector<std::any,_std::allocator<std::any>_> *this;
  bool bVar4;
  any elem;
  
  elem._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  elem._M_storage._M_ptr = (void *)0x0;
  std::any::operator=(v,(vector<std::any,_std::allocator<std::any>_> *)&elem);
  std::vector<std::any,_std::allocator<std::any>_>::~vector
            ((vector<std::any,_std::allocator<std::any>_> *)&elem);
  cVar1 = std::istream::get();
  if (cVar1 != '[') {
    return false;
  }
  bVar2 = false;
  do {
    bVar4 = false;
    while( true ) {
      if (bVar2) {
        return bVar2;
      }
      if (bVar4) {
        return bVar2;
      }
      if (*(int *)(input + *(long *)(*(long *)input + -0x18) + 0x20) != 0) {
        return false;
      }
      strip_white_space(input);
      iVar3 = std::istream::peek();
      if (iVar3 == 0x5d) break;
      elem._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
      elem._M_storage._M_ptr = (void *)0x0;
      bVar2 = deserialize(input,&elem);
      this = std::any_cast<std::vector<std::any,std::allocator<std::any>>&>(v);
      std::vector<std::any,_std::allocator<std::any>_>::emplace_back<std::any>(this,&elem);
      bVar4 = true;
      if (bVar2) {
        strip_white_space(input);
        iVar3 = std::istream::peek();
        iVar3 = iVar3 << 0x18;
        if ((iVar3 != 0x5d000000) && (iVar3 != 0x2c000000)) goto LAB_001378fc;
        bVar2 = iVar3 == 0x5d000000;
        std::istream::seekg((long)input,_S_cur);
        bVar4 = false;
      }
      else {
LAB_001378fc:
        bVar2 = false;
      }
      std::any::reset(&elem);
    }
    std::istream::seekg((long)input,_S_cur);
    bVar2 = true;
  } while( true );
}

Assistant:

bool json::parse_array(std::istream& input, any& v)
  {
    v = goodform::array_t();
    char c = (char)input.get();
    bool closingBraceFound = false;
    if (c == '[')
    {
      bool parseError = false;
      while(!closingBraceFound && !parseError && input.good())
      {
        strip_white_space(input);
        if ((closingBraceFound = (input.peek() == ']')))
        {
          input.seekg(1, std::ios::cur);
        }
        else
        {
          any elem;
          parseError = !deserialize(input, elem);
          get<goodform::array_t>(v).push_back(std::move(elem));
          if (!parseError)
          {
            strip_white_space(input);
            c = (char)input.peek();
            if ((closingBraceFound = (c == ']')) || !(parseError = (c != ',')))
              input.seekg(1, std::ios::cur);
          }
        }
      }
    }
    return closingBraceFound;
  }